

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O3

void __thiscall
QColorListView::setSelectedColorNames(QColorListView *this,QStringList *colorListNames)

{
  QColorListModel *pQVar1;
  int iVar2;
  Node<QString,_QHashDummyValue> *pNVar3;
  long *plVar4;
  int iVar5;
  QSet<QString> colors;
  QForeachContainer<QList<QString>_> _container_82;
  QItemSelection selection;
  QModelIndex index;
  QString colorName;
  QHashDummyValue local_b1;
  QHash<QString,_QHashDummyValue> local_b0;
  QArrayDataPointer<QString> local_a8;
  QString *local_90;
  QString *local_88;
  undefined4 local_80;
  QModelIndex local_78;
  QModelIndex local_60;
  QArrayDataPointer<char16_t> local_48;
  
  local_b0.d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
  local_78.m = (QAbstractItemModel *)0x0;
  local_78.r = 0;
  local_78.c = 0;
  local_78.i = 0;
  local_a8.d = (colorListNames->d).d;
  local_a8.ptr = (colorListNames->d).ptr;
  local_a8.size = (colorListNames->d).size;
  if (local_a8.d != (Data *)0x0) {
    LOCK();
    ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88 = local_a8.ptr + local_a8.size;
  local_80 = 1;
  local_90 = local_a8.ptr;
  if (local_a8.size != 0) {
    do {
      QColor::setNamedColor((QString *)&local_48);
      QColor::name((NameFormat)&local_60);
      QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QString,QHashDummyValue> *)&local_b0,(QString *)&local_60,&local_b1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
      local_90 = local_90 + 1;
    } while (local_90 != local_88);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  iVar5 = 0;
  while( true ) {
    pQVar1 = this->d->model;
    local_a8.d = (Data *)0xffffffffffffffff;
    local_a8.ptr = (QString *)0x0;
    local_a8.size = 0;
    iVar2 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_a8);
    if (iVar2 <= iVar5) break;
    pQVar1 = this->d->model;
    local_a8.d = (Data *)0xffffffffffffffff;
    local_a8.ptr = (QString *)0x0;
    local_a8.size = 0;
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_60,pQVar1,iVar5,0,&local_a8);
    if (local_60.m == (QAbstractItemModel *)0x0) {
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (QString *)0x0;
      local_a8.size = 0;
      local_90 = (QString *)0x2;
    }
    else {
      (**(code **)(*(long *)local_60.m + 0x90))(&local_a8,local_60.m,&local_60);
    }
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&local_a8);
    if (local_b0.d != (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::findNode
                         (local_b0.d,(Key *)&local_48);
      if (pNVar3 != (Node<QString,_QHashDummyValue> *)0x0) {
        QItemSelection::select(&local_78,&local_60);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    iVar5 = iVar5 + 1;
  }
  plVar4 = (long *)QAbstractItemView::selectionModel();
  (**(code **)(*plVar4 + 0x70))(plVar4,&local_78,3);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
            ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
  QHash<QString,_QHashDummyValue>::~QHash(&local_b0);
  return;
}

Assistant:

void QColorListView::setSelectedColorNames(const QStringList &colorListNames) {
    QSet<QString> colors;
    QItemSelection selection;

    foreach (const QString &colorName, colorListNames) {
        colors << d->internalColorName(QColor(colorName));
    }

    for (int i = 0; i < d->model->rowCount(); i++) {
        const QModelIndex index = d->model->index(i, 0);
        const QString colorName = index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString();

        if (colors.contains(colorName)) {
            selection.select(index, index);
        }
    }

    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}